

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

void __thiscall cfd::core::SigHashType::SetFromSigHashFlag(SigHashType *this,uint8_t flag)

{
  bool bVar1;
  bool bVar2;
  SigHashAlgorithm local_18;
  bool is_fork_id;
  bool is_anyone_can_pay;
  uint32_t sighash_byte;
  uint8_t flag_local;
  SigHashType *this_local;
  
  local_18 = (SigHashAlgorithm)flag;
  bVar1 = (flag & this->kSigHashAnyOneCanPay) != 0;
  if (bVar1) {
    local_18 = (this->kSigHashAnyOneCanPay ^ ~kSigHashDefault) & local_18;
  }
  bVar2 = (local_18 & this->kSigHashForkId) != kSigHashDefault;
  if (bVar2) {
    local_18 = (this->kSigHashForkId ^ ~kSigHashDefault) & local_18;
  }
  this->hash_algorithm_ = local_18;
  this->is_anyone_can_pay_ = bVar1;
  this->is_fork_id_ = bVar2;
  return;
}

Assistant:

void SigHashType::SetFromSigHashFlag(uint8_t flag) {
  uint32_t sighash_byte = flag;
  bool is_anyone_can_pay = false;
  bool is_fork_id = false;
  if (sighash_byte & SigHashType::kSigHashAnyOneCanPay) {
    sighash_byte &= ~kSigHashAnyOneCanPay;
    is_anyone_can_pay = true;
  }
  if (sighash_byte & SigHashType::kSigHashForkId) {
    sighash_byte &= ~kSigHashForkId;
    is_fork_id = true;
  }
  hash_algorithm_ = static_cast<SigHashAlgorithm>(sighash_byte);
  is_anyone_can_pay_ = is_anyone_can_pay;
  is_fork_id_ = is_fork_id;
}